

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void rw::decompressDXT1(uint8 *adst,int32 w,int32 h,uint8 *src)

{
  byte bVar1;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint8 *puVar8;
  long lVar9;
  byte *pbVar10;
  uint32 k_1;
  long lVar11;
  int iVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  uint local_a8 [3];
  ushort local_9c [2];
  uint local_98;
  uint local_94;
  uint local_90;
  undefined4 local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  undefined8 local_7c;
  uint local_74;
  uint local_70;
  undefined4 local_6c;
  uint8 *local_68;
  long local_60;
  ulong local_58;
  long local_50;
  byte local_48 [24];
  uint8 idx [16];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  local_60 = (long)((h * w) / 2);
  local_58 = 0;
  iVar12 = 0;
  local_68 = src;
  puVar8 = src;
  for (local_50 = 0; local_50 < local_60; local_50 = local_50 + 8) {
    uVar13 = *(ushort *)(puVar8 + local_50);
    uVar14 = *(ushort *)(puVar8 + local_50 + 2);
    local_a8[0] = ((uint)(uVar13 >> 0xb) * 0xff) / 0x1f;
    local_a8[1] = ((uVar13 >> 5 & 0x3f) * 0xff) / 0x3f;
    local_a8[2] = ((uVar13 & 0x1f) * 0xff) / 0x1f;
    local_9c[0] = 0xff;
    local_9c[1] = 0;
    local_98 = ((uint)(uVar14 >> 0xb) * 0xff) / 0x1f;
    local_94 = ((uVar14 >> 5 & 0x3f) * 0xff) / 0x3f;
    local_90 = ((uVar14 & 0x1f) * 0xff) / 0x1f;
    local_8c = 0xff;
    if (uVar14 < uVar13) {
      local_88 = (local_98 + local_a8[0] * 2) / 3;
      local_84 = (local_94 + local_a8[1] * 2) / 3;
      local_80 = (local_90 + local_a8[2] * 2) / 3;
      local_7c = CONCAT44((local_a8[0] + local_98 * 2) / 3,0xff);
      local_74 = (local_a8[1] + local_94 * 2) / 3;
      local_70 = (local_a8[2] + local_90 * 2) / 3;
      local_6c = 0xff;
    }
    else {
      local_88 = local_98 + local_a8[0] >> 1;
      local_84 = local_94 + local_a8[1] >> 1;
      local_80 = local_90 + local_a8[2] >> 1;
      local_7c = 0xff;
      local_74 = 0;
      local_70 = 0;
      local_6c = 0;
    }
    uVar6 = *(uint *)(src + local_50 + 4);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      local_48[lVar9] = (byte)uVar6 & 3;
      uVar6 = uVar6 >> 2;
    }
    iVar7 = w * (int)local_58 + iVar12;
    pbVar10 = local_48;
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
        uVar5 = (ulong)pbVar10[lVar11];
        uVar13 = (ushort)local_a8[uVar5 * 4] & 0xff;
        uVar14 = (ushort)local_a8[uVar5 * 4 + 1] & 0xff;
        uVar15 = local_9c[uVar5 * 8 + -2] & 0xff;
        uVar16 = local_9c[uVar5 * 8] & 0xff;
        bVar1 = (uVar13 != 0) * (uVar13 < 0x100) * (char)(ushort)local_a8[uVar5 * 4] -
                (0xff < uVar13);
        bVar2 = (uVar14 != 0) * (uVar14 < 0x100) * (char)(ushort)local_a8[uVar5 * 4 + 1] -
                (0xff < uVar14);
        bVar3 = (uVar15 != 0) * (uVar15 < 0x100) * (char)local_9c[uVar5 * 8 + -2] - (0xff < uVar15);
        bVar4 = (uVar16 != 0) * (uVar16 < 0x100) * (char)local_9c[uVar5 * 8] - (0xff < uVar16);
        *(uint *)(adst + (ulong)(uint)(iVar7 + (int)lVar11) * 4) =
             CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                      CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                               CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                        (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1))));
      }
      pbVar10 = pbVar10 + 4;
      iVar7 = iVar7 + w;
    }
    iVar12 = iVar12 + 4;
    if (w <= iVar12) {
      iVar12 = 0;
      local_58 = (ulong)((int)local_58 + 4);
    }
    puVar8 = local_68;
  }
  return;
}

Assistant:

void
decompressDXT1(uint8 *adst, int32 w, int32 h, uint8 *src)
{
	/* j loops through old texels
	 * x and y loop through new texels */
	int32 x = 0, y = 0;
	uint32 c[4][4];
	uint8 idx[16];
	uint8 (*dst)[4] = (uint8(*)[4])adst;
	for(int32 j = 0; j < w*h/2; j += 8){
		/* calculate colors */
		uint32 col0 = *((uint16*)&src[j+0]);
		uint32 col1 = *((uint16*)&src[j+2]);
		c[0][0] = ((col0>>11) & 0x1F)*0xFF/0x1F;
		c[0][1] = ((col0>> 5) & 0x3F)*0xFF/0x3F;
		c[0][2] = ( col0      & 0x1F)*0xFF/0x1F;
		c[0][3] = 0xFF;

		c[1][0] = ((col1>>11) & 0x1F)*0xFF/0x1F;
		c[1][1] = ((col1>> 5) & 0x3F)*0xFF/0x3F;
		c[1][2] = ( col1      & 0x1F)*0xFF/0x1F;
		c[1][3] = 0xFF;
		if(col0 > col1){
			c[2][0] = (2*c[0][0] + 1*c[1][0])/3;
			c[2][1] = (2*c[0][1] + 1*c[1][1])/3;
			c[2][2] = (2*c[0][2] + 1*c[1][2])/3;
			c[2][3] = 0xFF;

			c[3][0] = (1*c[0][0] + 2*c[1][0])/3;
			c[3][1] = (1*c[0][1] + 2*c[1][1])/3;
			c[3][2] = (1*c[0][2] + 2*c[1][2])/3;
			c[3][3] = 0xFF;
		}else{
			c[2][0] = (c[0][0] + c[1][0])/2;
			c[2][1] = (c[0][1] + c[1][1])/2;
			c[2][2] = (c[0][2] + c[1][2])/2;
			c[2][3] = 0xFF;

			c[3][0] = 0x00;
			c[3][1] = 0x00;
			c[3][2] = 0x00;
			c[3][3] = 0x00;
		}

		/* make index list */
		uint32 indices = *((uint32*)&src[j+4]);
		for(int32 k = 0; k < 16; k++){
			idx[k] = indices & 0x3;
			indices >>= 2;
		}

		/* write bytes */
		for(uint32 l = 0; l < 4; l++)
			for(uint32 k = 0; k < 4; k++){
				dst[(y+l)*w + x+k][0] = c[idx[l*4+k]][0];
				dst[(y+l)*w + x+k][1] = c[idx[l*4+k]][1];
				dst[(y+l)*w + x+k][2] = c[idx[l*4+k]][2];
				dst[(y+l)*w + x+k][3] = c[idx[l*4+k]][3];
			}
		x += 4;
		if(x >= w){
			y += 4;
			x = 0;
		}
	}
}